

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitCallIndirect(wasm::CallIndirect__(void *this,CallIndirect *curr)

{
  size_t sVar1;
  Expression *pEVar2;
  char *pcVar3;
  Expression **ppEVar4;
  Value *this_00;
  ScopedTemp *this_01;
  bool bVar5;
  bool bVar6;
  JsType JVar7;
  Ref RVar8;
  void *pvVar9;
  long *plVar10;
  Value *pVVar11;
  Ref RVar12;
  long lVar13;
  Ref *pRVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  iterator __end3;
  size_t __n;
  long *plVar18;
  bool bVar19;
  IString nextResult;
  IString nextResult_00;
  IString op;
  IString possible;
  IString possible_00;
  undefined1 local_368 [8];
  EffectAnalyzer targetEffects;
  undefined1 local_1e0 [8];
  ScopedTemp idx;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_198;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_168;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_138;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_e0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_b0;
  ulong local_80;
  Value *local_78;
  Ref local_70;
  Ref theCall;
  long *local_58;
  long *local_48;
  Ref local_38;
  Ref ret;
  
  if (curr->isReturn == true) {
    Fatal::Fatal((Fatal *)local_368);
    Fatal::operator<<((Fatal *)local_368,(char (*) [40])"tail calls not yet supported in wasm2js");
    Fatal::~Fatal((Fatal *)local_368);
  }
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_368,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),curr->target);
  bVar5 = EffectAnalyzer::hasAnything((EffectAnalyzer *)local_368);
  if (bVar5) {
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar1 == 0) {
      bVar5 = false;
    }
    else {
      bVar5 = false;
      uVar17 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar17) goto LAB_00d17dee;
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)local_1e0,(PassOptions *)(*this + 0x60),
                   *(Module **)((long)this + 0x20),
                   (curr->operands).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [uVar17]);
        bVar6 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_368,(EffectAnalyzer *)local_1e0)
        ;
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_b0);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_e0);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_138);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_168);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_198);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&idx.temp);
        if (bVar6) {
          bVar5 = true;
        }
        bVar19 = sVar1 - 1 != uVar17;
        uVar17 = uVar17 + 1;
      } while (bVar19 && !bVar6);
    }
  }
  else {
    bVar5 = false;
  }
  nextResult.str._M_str = DAT_010d1378;
  nextResult.str._M_len = EXPRESSION_RESULT;
  RVar8 = visit(wasm::Expression*,wasm::IString_(this,curr->target,nextResult);
  RVar8 = makeJsCoercion(RVar8,JS_INT);
  pcVar3 = DAT_010d1358;
  sVar1 = FUNCTION_TABLE;
  if (bVar5) {
    local_38.inst = (Value *)0x0;
    possible.str._M_str = DAT_010d1368;
    possible.str._M_len = (size_t)NO_RESULT;
    RVar12.inst = NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (local_1e0,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible);
    theCall.inst = (Value *)(curr->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            .usedElements;
    local_78 = RVar8.inst;
    if (theCall.inst == (Value *)0x0) {
      local_58 = (long *)0x0;
      plVar18 = (long *)0x0;
      local_48 = (long *)0x0;
    }
    else {
      local_48 = (long *)0x0;
      plVar18 = (long *)0x0;
      local_58 = (long *)0x0;
      pVVar11 = (Value *)0x0;
      do {
        if ((Value *)(curr->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                     usedElements <= pVVar11) goto LAB_00d17dee;
        pEVar2 = (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [(long)pVVar11];
        pvVar9 = operator_new(0x28);
        possible_00.str._M_str = DAT_010d1368;
        possible_00.str._M_len = (size_t)NO_RESULT;
        RVar12.inst = NO_RESULT;
        ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                  (pvVar9,(Type)(pEVar2->type).id,*this,*(Function **)((long)this + 0x18),
                   possible_00);
        if (plVar18 == local_58) {
          __n = (long)plVar18 - (long)local_48;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar16 = (long)__n >> 3;
          uVar17 = 1;
          if (plVar18 != local_48) {
            uVar17 = uVar16;
          }
          uVar15 = uVar17 + uVar16;
          if (0xffffffffffffffe < uVar15) {
            uVar15 = 0xfffffffffffffff;
          }
          local_80 = 0xfffffffffffffff;
          if (!CARRY8(uVar17,uVar16)) {
            local_80 = uVar15;
          }
          if (local_80 == 0) {
            plVar10 = (long *)0x0;
          }
          else {
            plVar10 = (long *)operator_new(local_80 * 8);
          }
          plVar10[uVar16] = (long)pvVar9;
          if (0 < (long)__n) {
            memmove(plVar10,local_48,__n);
          }
          if (local_48 != (long *)0x0) {
            operator_delete(local_48,(long)local_58 - (long)local_48);
          }
          plVar18 = (long *)(__n + (long)plVar10);
          local_58 = plVar10 + local_80;
          local_48 = plVar10;
        }
        else {
          *plVar18 = (long)pvVar9;
        }
        RVar8 = visitAndAssign(wasm::Expression*,wasm::IString_
                          (this,pEVar2,(IString)*(string_view *)(*plVar18 + 0x10));
        if (local_38.inst != (Value *)0x0) {
          RVar8 = cashew::ValueBuilder::makeSeq(local_38,RVar8);
        }
        plVar18 = plVar18 + 1;
        pVVar11 = (Value *)((long)&pVVar11->type + 1);
        local_38.inst = RVar8.inst;
      } while (theCall.inst != pVVar11);
    }
    pvVar9 = (void *)0x18;
    pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar11->type = Null;
    cashew::Value::free(pVVar11,pvVar9);
    pVVar11->type = String;
    (pVVar11->field_1).ref.inst = (Value *)idx.type.id;
    (pVVar11->field_1).str.str._M_str = (char *)idx.temp.str._M_len;
    op.str._M_str = (char *)local_78;
    op.str._M_len = DAT_010d1a30;
    RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar11,cashew::SET,op,RVar12);
    if (local_38.inst != (Value *)0x0) {
      RVar8 = cashew::ValueBuilder::makeSeq(local_38,RVar8);
    }
    pcVar3 = DAT_010d1358;
    sVar1 = FUNCTION_TABLE;
    pvVar9 = (void *)0x18;
    local_38.inst = RVar8.inst;
    RVar8.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar8.inst)->type = Null;
    cashew::Value::free(RVar8.inst,pvVar9);
    (RVar8.inst)->type = String;
    ((RVar8.inst)->field_1).str.str._M_len = sVar1;
    ((RVar8.inst)->field_1).str.str._M_str = pcVar3;
    pvVar9 = (void *)0x18;
    RVar12.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar12.inst)->type = Null;
    cashew::Value::free(RVar12.inst,pvVar9);
    (RVar12.inst)->type = String;
    ((RVar12.inst)->field_1).ref.inst = (Value *)idx.type.id;
    ((RVar12.inst)->field_1).str.str._M_str = (char *)idx.temp.str._M_len;
    RVar8 = cashew::ValueBuilder::makeSub(RVar8,RVar12);
    local_70 = cashew::ValueBuilder::makeCall(RVar8);
    if ((long)plVar18 - (long)local_48 != 0) {
      lVar13 = (long)plVar18 - (long)local_48 >> 3;
      theCall.inst = (Value *)(lVar13 + (ulong)(lVar13 == 0));
      pVVar11 = (Value *)0x0;
      do {
        if ((Value *)(curr->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                     usedElements <= pVVar11) {
LAB_00d17dee:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        sVar1 = *(size_t *)(local_48[(long)pVVar11] + 0x10);
        pcVar3 = *(char **)(local_48[(long)pVVar11] + 0x18);
        ppEVar4 = (curr->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
        pRVar14 = cashew::Ref::operator[](&local_70,2);
        this_00 = pRVar14->inst;
        pvVar9 = (void *)0x18;
        RVar8.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        (RVar8.inst)->type = Null;
        cashew::Value::free(RVar8.inst,pvVar9);
        (RVar8.inst)->type = String;
        ((RVar8.inst)->field_1).str.str._M_len = sVar1;
        ((RVar8.inst)->field_1).str.str._M_str = pcVar3;
        JVar7 = wasmToJsType((Type)(ppEVar4[(long)pVVar11]->type).id);
        RVar8 = makeJsCoercion(RVar8,JVar7);
        cashew::Value::push_back(this_00,RVar8);
        pVVar11 = (Value *)((long)&pVVar11->type + 1);
      } while (theCall.inst != pVVar11);
    }
    RVar8.inst = local_70.inst;
    JVar7 = wasmToJsType((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).
                               super_Expression.type.id);
    local_70 = makeJsCoercion(RVar8,JVar7);
    RVar8 = local_70;
    plVar10 = local_48;
    if (local_38.inst != (Value *)0x0) {
      RVar8 = cashew::ValueBuilder::makeSeq(local_38,local_70);
    }
    for (; local_38.inst = RVar8.inst, plVar10 != plVar18; plVar10 = plVar10 + 1) {
      this_01 = (ScopedTemp *)*plVar10;
      if (this_01 != (ScopedTemp *)0x0) {
        processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp(this_01);
        operator_delete(this_01,0x28);
      }
      RVar8.inst = local_38.inst;
    }
    if (local_48 != (long *)0x0) {
      operator_delete(local_48,(long)local_58 - (long)local_48);
    }
    processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_1e0);
  }
  else {
    pvVar9 = (void *)0x18;
    RVar12.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar12.inst)->type = Null;
    cashew::Value::free(RVar12.inst,pvVar9);
    (RVar12.inst)->type = String;
    ((RVar12.inst)->field_1).str.str._M_len = sVar1;
    ((RVar12.inst)->field_1).str.str._M_str = pcVar3;
    RVar8 = cashew::ValueBuilder::makeSub(RVar12,RVar8);
    local_38 = cashew::ValueBuilder::makeCall(RVar8);
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar1 != 0) {
      uVar17 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar17) goto LAB_00d17dee;
        pEVar2 = (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [uVar17];
        pRVar14 = cashew::Ref::operator[](&local_38,2);
        pVVar11 = pRVar14->inst;
        nextResult_00.str._M_str = DAT_010d1378;
        nextResult_00.str._M_len = EXPRESSION_RESULT;
        RVar8 = visit(wasm::Expression*,wasm::IString_(this,pEVar2,nextResult_00);
        cashew::Value::push_back(pVVar11,RVar8);
        uVar17 = uVar17 + 1;
      } while (sVar1 != uVar17);
    }
    RVar8.inst = local_38.inst;
    JVar7 = wasmToJsType((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).
                               super_Expression.type.id);
    local_38 = makeJsCoercion(RVar8,JVar7);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&targetEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&targetEffects.features);
  return (Ref)local_38.inst;
}

Assistant:

Ref visitCallIndirect(CallIndirect* curr) {
      if (curr->isReturn) {
        Fatal() << "tail calls not yet supported in wasm2js";
      }
      // If the target has effects that interact with the operands, we must
      // reorder it to the start.
      bool mustReorder = false;
      EffectAnalyzer targetEffects(parent->options, *module, curr->target);
      if (targetEffects.hasAnything()) {
        for (auto* operand : curr->operands) {
          if (targetEffects.invalidates(
                EffectAnalyzer(parent->options, *module, operand))) {
            mustReorder = true;
            break;
          }
        }
      }
      // Ensure the function pointer is a number. In general in wasm2js we are
      // ok with true/false being present, as they are immediately cast to a
      // number anyhow on their use. However, FUNCTION_TABLE[true] is *not* the
      // same as FUNCTION_TABLE[1], so we must cast. This is a rare exception
      // because FUNCTION_TABLE is just a normal JS object, not a typed array
      // or a mathematical operation (all of which coerce to a number for us).
      auto target = visit(curr->target, EXPRESSION_RESULT);
      target = makeJsCoercion(target, JS_INT);
      if (mustReorder) {
        Ref ret;
        ScopedTemp idx(Type::i32, parent, func);
        std::vector<ScopedTemp*> temps; // TODO: utility class, with destructor?
        for (auto* operand : curr->operands) {
          temps.push_back(new ScopedTemp(operand->type, parent, func));
          IString temp = temps.back()->temp;
          sequenceAppend(ret, visitAndAssign(operand, temp));
        }
        sequenceAppend(ret,
                       ValueBuilder::makeBinary(
                         ValueBuilder::makeName(idx.getName()), SET, target));
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), idx.getAstName()));
        for (size_t i = 0; i < temps.size(); i++) {
          IString temp = temps[i]->temp;
          auto& operand = curr->operands[i];
          theCall[2]->push_back(makeJsCoercion(ValueBuilder::makeName(temp),
                                               wasmToJsType(operand->type)));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        sequenceAppend(ret, theCall);
        for (auto temp : temps) {
          delete temp;
        }
        return ret;
      } else {
        // Target has no side effects, emit simple code
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), target));
        for (auto* operand : curr->operands) {
          theCall[2]->push_back(visit(operand, EXPRESSION_RESULT));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        return theCall;
      }
    }